

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O3

bool __thiscall
tinyusdz::ascii::AsciiParser::ParseDictElement
          (AsciiParser *this,string *out_key,MetaVariable *out_var)

{
  uint8_t uVar1;
  uint8_t uVar2;
  StreamReader *pSVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  bool bVar7;
  uint32_t uVar8;
  const_iterator cVar9;
  ostream *poVar10;
  long *plVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  uint *args;
  ulong uVar13;
  undefined8 uVar15;
  _Alloc_hider _Var16;
  vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_> arrs;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> vss;
  token val;
  MetaVariable metavar;
  string type_name;
  string key_name;
  bool local_309;
  string local_308;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8;
  undefined1 local_2a8 [4];
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_298;
  undefined2 uStack_288;
  undefined2 uStack_286;
  float fStack_284;
  float local_280;
  float fStack_27c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_278;
  double local_268;
  double dStack_260;
  double local_258;
  double local_250;
  double dStack_248;
  double local_240;
  double dStack_238;
  double local_230;
  storage_union local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  undefined1 local_208 [32];
  storage_union local_1e8;
  undefined8 *local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1d0;
  undefined8 local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0 [4];
  ios_base local_178 [264];
  string local_70;
  string local_50;
  undefined8 uVar14;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  bVar7 = ReadIdentifier(this,&local_70);
  _local_2a8 = (pointer)CONCAT44(fStack_2a4,local_2a8);
  if (!bVar7) {
LAB_00317e24:
    bVar7 = false;
    goto LAB_00317e26;
  }
  bVar7 = SkipWhitespace(this);
  _local_2a8 = (pointer)CONCAT44(fStack_2a4,local_2a8);
  if (!bVar7) goto LAB_00317e24;
  cVar9 = ::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&this->_supported_prim_attr_types,&local_70);
  if ((_Rb_tree_header *)cVar9._M_node ==
      &(this->_supported_prim_attr_types)._M_t._M_impl.super__Rb_tree_header) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1e8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1e8,"ParseDictElement",0x10);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
    poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x2fa);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_228
                     ,"Unknown or unsupported type `",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_70)
    ;
    plVar11 = (long *)::std::__cxx11::string::append((char *)&local_228);
    paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 == paVar12) {
      aStack_298._8_8_ = plVar11[3];
      aStack_298._M_allocated_capacity._0_4_ = (undefined4)paVar12->_M_allocated_capacity;
      aStack_298._M_allocated_capacity._4_4_ = (undefined4)(paVar12->_M_allocated_capacity >> 0x20);
      _local_2a8 = (pointer)&aStack_298;
    }
    else {
      aStack_298._M_allocated_capacity._0_4_ = (undefined4)paVar12->_M_allocated_capacity;
      aStack_298._M_allocated_capacity._4_4_ = (undefined4)(paVar12->_M_allocated_capacity >> 0x20);
      _local_2a8 = (pointer)*plVar11;
    }
    lVar6 = plVar11[1];
    fStack_2a0 = (float)lVar6;
    fStack_29c = (float)((ulong)lVar6 >> 0x20);
    *plVar11 = (long)paVar12;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1e8,_local_2a8,lVar6);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_local_2a8 != &aStack_298) {
      operator_delete(_local_2a8,
                      CONCAT44(aStack_298._M_allocated_capacity._4_4_,
                               aStack_298._M_allocated_capacity._0_4_) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228.dynamic != &local_218) {
      operator_delete(local_228.dynamic,local_218._M_allocated_capacity + 1);
    }
LAB_00317dc3:
    ::std::__cxx11::stringbuf::str();
    PushError(this,(string *)local_2a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_local_2a8 != &aStack_298) {
      operator_delete(_local_2a8,
                      CONCAT44(aStack_298._M_allocated_capacity._4_4_,
                               aStack_298._M_allocated_capacity._0_4_) + 1);
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1e8);
    ::std::ios_base::~ios_base(local_178);
    goto LAB_00317e24;
  }
  pSVar3 = this->_sr;
  uVar4 = pSVar3->length_;
  uVar5 = pSVar3->idx_;
  uVar13 = uVar5 + 1;
  _local_2a8 = (pointer)CONCAT44(fStack_2a4,local_2a8);
  if (uVar4 < uVar13) goto LAB_00317e24;
  uVar1 = pSVar3->binary_[uVar5];
  pSVar3->idx_ = uVar13;
  if (uVar1 != '[') {
    _local_2a8 = (pointer)CONCAT44(fStack_2a4,local_2a8);
    if (uVar5 <= uVar4 && -1 < (long)uVar5) {
      pSVar3->idx_ = uVar5;
      goto LAB_00317c21;
    }
    goto LAB_00317e24;
  }
  _local_2a8 = (pointer)CONCAT44(fStack_2a4,local_2a8);
  if (uVar4 < uVar5 + 2) goto LAB_00317e24;
  uVar2 = pSVar3->binary_[uVar13];
  pSVar3->idx_ = uVar5 + 2;
  if (uVar2 != ']') {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1e8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1e8,"ParseDictElement",0x10);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
    poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x30e);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1e8,"Invalid syntax found.",0x15);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"\n",1);
    goto LAB_00317dc3;
  }
LAB_00317c21:
  bVar7 = SkipWhitespace(this);
  _local_2a8 = (pointer)CONCAT44(fStack_2a4,local_2a8);
  if (!bVar7) goto LAB_00317e24;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  bVar7 = ReadIdentifier(this,&local_50);
  if ((!bVar7) && (bVar7 = ReadStringLiteral(this,&local_50), !bVar7)) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1e8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1e8,"ParseDictElement",0x10);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
    poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x322);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1e8,"Failed to parse dictionary key identifier.\n",0x2b);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"\n",1);
    ::std::__cxx11::stringbuf::str();
    PushError(this,(string *)local_2a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(fStack_2a4,local_2a8) != &aStack_298) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(fStack_2a4,local_2a8),
                      CONCAT44(aStack_298._M_allocated_capacity._4_4_,
                               aStack_298._M_allocated_capacity._0_4_) + 1);
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1e8);
    ::std::ios_base::~ios_base(local_178);
LAB_00317f75:
    bVar7 = false;
    goto LAB_00317f77;
  }
  bVar7 = SkipWhitespace(this);
  if (((!bVar7) || (bVar7 = Expect(this,'='), !bVar7)) || (bVar7 = SkipWhitespace(this), !bVar7))
  goto LAB_00317f75;
  uVar8 = tinyusdz::value::GetTypeId(&local_70);
  local_218._M_allocated_capacity =
       (size_type)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
  local_228.dynamic =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  local_218._M_local_buf[8] = '\0';
  local_208._0_8_ = (pointer)0x0;
  local_208[8] = 0;
  local_208._9_7_ = 0;
  local_208[0x10] = 0;
  local_208._17_8_ = 0;
  args = &switchD_00317cf9::switchdataD_003ae2f0;
  switch(uVar8) {
  case 6:
    if (uVar1 == '[') {
      local_2c8._M_allocated_capacity = 0;
      local_2c8._8_8_ = 0;
      local_2b8._M_allocated_capacity = 0;
      bVar7 = ParseBasicTypeArray<tinyusdz::Token>
                        (this,(vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                              &local_2c8);
      if (bVar7) {
        linb::any::operator=
                  ((any *)&local_228,
                   (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&local_2c8);
        ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
                  ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&local_2c8);
        break;
      }
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,"ParseDictElement",0x10);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
      poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
      local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_308,"Failed to parse a value of type `{}[]`","");
      local_2d8._M_allocated_capacity._0_6_ = 0x6e656b6f74;
      local_2e8._8_8_ = 5;
      local_2e8._M_allocated_capacity = (size_type)&local_2d8;
      fmt::format<std::__cxx11::string>
                ((string *)local_2a8,(fmt *)&local_308,(string *)&local_2e8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
      poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_1e8,(char *)CONCAT44(fStack_2a4,local_2a8),
                           CONCAT44(fStack_29c,fStack_2a0));
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(fStack_2a4,local_2a8) != &aStack_298) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(fStack_2a4,local_2a8),
                        CONCAT44(aStack_298._M_allocated_capacity._4_4_,
                                 aStack_298._M_allocated_capacity._0_4_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8._M_allocated_capacity != &local_2d8) {
        operator_delete((void *)local_2e8._M_allocated_capacity,local_2d8._M_allocated_capacity + 1)
        ;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308._M_dataplus._M_p != &local_308.field_2) {
        operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
      }
      ::std::__cxx11::stringbuf::str();
      PushError(this,(string *)local_2a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(fStack_2a4,local_2a8) != &aStack_298) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(fStack_2a4,local_2a8),
                        CONCAT44(aStack_298._M_allocated_capacity._4_4_,
                                 aStack_298._M_allocated_capacity._0_4_) + 1);
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1e8);
      ::std::ios_base::~ios_base(local_178);
      ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&local_2c8);
    }
    else {
      _local_2a8 = (pointer)&aStack_298;
      fStack_2a0 = 0.0;
      fStack_29c = 0.0;
      aStack_298._M_allocated_capacity._0_4_ =
           (uint)(uint3)aStack_298._M_allocated_capacity._1_3_ << 8;
      local_309 = ReadBasicType(this,(token *)local_2a8);
      if (local_309) {
        linb::any::operator=((any *)&local_228,(Token *)local_2a8);
        uVar15 = _local_2a8;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
        poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
        local_2e8._M_allocated_capacity = (size_type)&local_2d8;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2e8,"Failed to parse a value of type `{}`","");
        local_2b8._M_allocated_capacity._0_6_ = 0x6e656b6f74;
        local_2c8._8_8_ = 5;
        local_2c8._M_allocated_capacity = (size_type)&local_2b8;
        fmt::format<std::__cxx11::string>
                  ((string *)&local_308,(fmt *)local_2e8._M_local_buf,(string *)&local_2c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_1e8,local_308._M_dataplus._M_p,
                             local_308._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_308._M_dataplus._M_p != &local_308.field_2) {
          operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c8._M_allocated_capacity != &local_2b8) {
          operator_delete((void *)local_2c8._M_allocated_capacity,
                          local_2b8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e8._M_allocated_capacity != &local_2d8) {
          operator_delete((void *)local_2e8._M_allocated_capacity,
                          local_2d8._M_allocated_capacity + 1);
        }
        ::std::__cxx11::stringbuf::str();
        PushError(this,&local_308);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_308._M_dataplus._M_p != &local_308.field_2) {
          operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1e8);
        ::std::ios_base::~ios_base(local_178);
        uVar15 = _local_2a8;
      }
      _local_2a8 = (pointer)uVar15;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)uVar15 == &aStack_298) goto LAB_0031f874;
LAB_0031c939:
      uVar13 = CONCAT44(aStack_298._M_allocated_capacity._4_4_,
                        aStack_298._M_allocated_capacity._0_4_) + 1;
      _local_2a8 = (pointer)uVar15;
LAB_0031f86f:
      operator_delete((void *)uVar15,uVar13);
LAB_0031f874:
      if (local_309 != false) break;
    }
    goto LAB_0031facc;
  case 7:
    if (uVar1 != '[') {
      fStack_2a0 = 0.0;
      fStack_29c = 0.0;
      aStack_298._M_allocated_capacity._0_4_ =
           (uint)(uint3)aStack_298._M_allocated_capacity._1_3_ << 8;
      uStack_288._0_1_ = false;
      uStack_288._1_1_ = false;
      fStack_284 = 0.0;
      local_280 = 0.0;
      _local_2a8 = (pointer)&aStack_298;
      local_309 = ReadBasicType(this,(StringData *)local_2a8);
      if (local_309) {
        linb::any::operator=((any *)&local_228,(StringData *)local_2a8);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
        poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x35f);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,"Failed to parse `string`",0x18);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"\n",1);
        ::std::__cxx11::stringbuf::str();
        PushError(this,&local_308);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_308._M_dataplus._M_p != &local_308.field_2) {
          operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1e8);
        ::std::ios_base::~ios_base(local_178);
      }
      uVar15 = _local_2a8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_local_2a8 != &aStack_298) goto LAB_0031c939;
      goto LAB_0031f874;
    }
    local_308._M_dataplus._M_p = (pointer)0x0;
    local_308._M_string_length = 0;
    local_308.field_2._M_allocated_capacity = 0;
    bVar7 = ParseBasicTypeArray<tinyusdz::value::StringData>
                      (this,(vector<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
                             *)&local_308);
    if (bVar7) {
      linb::any::operator=
                ((any *)&local_228,
                 (vector<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
                  *)&local_308);
      ::std::vector<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>::
      ~vector((vector<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_> *)
              &local_308);
      break;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1e8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1e8,"ParseDictElement",0x10);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
    poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x359);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1e8,"Failed to parse `string[]`",0x1a);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"\n",1);
    ::std::__cxx11::stringbuf::str();
    PushError(this,(string *)local_2a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(fStack_2a4,local_2a8) != &aStack_298) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(fStack_2a4,local_2a8),
                      CONCAT44(aStack_298._M_allocated_capacity._4_4_,
                               aStack_298._M_allocated_capacity._0_4_) + 1);
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1e8);
    ::std::ios_base::~ios_base(local_178);
    ::std::vector<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>::
    ~vector((vector<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_> *)
            &local_308);
    goto LAB_0031facc;
  default:
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1e8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1e8,"ParseDictElement",0x10);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
    poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x381);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a8,
                     "Unsupported or invalid type for Metadatum:",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_70)
    ;
    poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1e8,(char *)CONCAT44(fStack_2a4,local_2a8),
                         CONCAT44(fStack_29c,fStack_2a0));
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(fStack_2a4,local_2a8) != &aStack_298) {
      uVar15 = CONCAT44(aStack_298._M_allocated_capacity._4_4_,
                        aStack_298._M_allocated_capacity._0_4_);
      _Var16._M_p = (pointer)CONCAT44(fStack_2a4,local_2a8);
LAB_0031fa6b:
      operator_delete(_Var16._M_p,uVar15 + 1);
    }
    goto LAB_0031fa73;
  case 9:
    if (uVar1 == '[') {
      local_2a8 = (undefined1  [4])0x0;
      fStack_2a4 = 0.0;
      fStack_2a0 = 0.0;
      aStack_298._M_allocated_capacity._0_4_ = 0;
      aStack_298._M_allocated_capacity._4_4_ = 0;
      aStack_298._8_8_ = aStack_298._8_8_ & 0xffffffff00000000;
      uStack_288._0_1_ = false;
      uStack_288._1_1_ = false;
      uStack_286 = 0;
      fStack_284 = 0.0;
      local_309 = ParseBasicTypeArray<bool>(this,(vector<bool,_std::allocator<bool>_> *)local_2a8);
      if (local_309) {
        linb::any::operator=((any *)&local_228,(vector<bool,_std::allocator<bool>_> *)local_2a8);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
        poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
        local_2e8._M_allocated_capacity = (size_type)&local_2d8;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2e8,"Failed to parse a value of type `{}[]`","");
        local_2c8._8_8_ = 4;
        local_2b8._M_allocated_capacity._0_5_ = 0x6c6f6f62;
        local_2c8._M_allocated_capacity = (size_type)&local_2b8;
        fmt::format<std::__cxx11::string>
                  ((string *)&local_308,(fmt *)local_2e8._M_local_buf,(string *)&local_2c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_1e8,local_308._M_dataplus._M_p,
                             local_308._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_308._M_dataplus._M_p != &local_308.field_2) {
          operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c8._M_allocated_capacity != &local_2b8) {
          operator_delete((void *)local_2c8._M_allocated_capacity,
                          local_2b8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e8._M_allocated_capacity != &local_2d8) {
          operator_delete((void *)local_2e8._M_allocated_capacity,
                          local_2d8._M_allocated_capacity + 1);
        }
        ::std::__cxx11::stringbuf::str();
        PushError(this,&local_308);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_308._M_dataplus._M_p != &local_308.field_2) {
          operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1e8);
        ::std::ios_base::~ios_base(local_178);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_local_2a8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) goto LAB_0031f874;
      uVar14 = CONCAT44(fStack_284,CONCAT22(uStack_286,uStack_288));
      uVar15 = _local_2a8;
LAB_0031f86c:
      uVar13 = uVar14 - uVar15;
      _local_2a8 = (pointer)CONCAT44(fStack_2a4,local_2a8);
      goto LAB_0031f86f;
    }
    bVar7 = ReadBasicType(this,(bool *)local_2c8._M_local_buf);
    if (bVar7) {
      linb::any::operator=((any *)&local_228,(bool *)local_2c8._M_local_buf);
      break;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1e8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1e8,"ParseDictElement",0x10);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
    poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
    local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_308,"Failed to parse a value of type `{}`","");
    local_2d8._M_allocated_capacity._0_4_ = 0x6c6f6f62;
LAB_0031dff6:
    local_2e8._8_8_ = 4;
    local_2d8._M_local_buf[4] = 0;
LAB_0031f9ea:
    local_2e8._M_allocated_capacity = (size_type)&local_2d8;
    fmt::format<std::__cxx11::string>
              ((string *)local_2a8,(fmt *)&local_308,(string *)&local_2e8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
    poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1e8,(char *)CONCAT44(fStack_2a4,local_2a8),
                         CONCAT44(fStack_29c,fStack_2a0));
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(fStack_2a4,local_2a8) != &aStack_298) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(fStack_2a4,local_2a8),
                      CONCAT44(aStack_298._M_allocated_capacity._4_4_,
                               aStack_298._M_allocated_capacity._0_4_) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_allocated_capacity != &local_2d8) {
      operator_delete((void *)local_2e8._M_allocated_capacity,local_2d8._M_allocated_capacity + 1);
    }
    uVar15 = local_308.field_2._M_allocated_capacity;
    _Var16._M_p = local_308._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_dataplus._M_p != &local_308.field_2) goto LAB_0031fa6b;
LAB_0031fa73:
    ::std::__cxx11::stringbuf::str();
    PushError(this,(string *)local_2a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(fStack_2a4,local_2a8) != &aStack_298) {
      uVar15 = CONCAT44(aStack_298._M_allocated_capacity._4_4_,
                        aStack_298._M_allocated_capacity._0_4_);
      _Var16._M_p = (pointer)CONCAT44(fStack_2a4,local_2a8);
LAB_0031faa3:
      operator_delete(_Var16._M_p,uVar15 + 1);
    }
LAB_0031faab:
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1e8);
    ::std::ios_base::~ios_base(local_178);
    goto LAB_0031facc;
  case 0xe:
    if (uVar1 == '[') {
      local_2c8._M_allocated_capacity = 0;
      local_2c8._8_8_ = 0;
      local_2b8._M_allocated_capacity = 0;
      local_309 = ParseBasicTypeArray<tinyusdz::value::half>
                            (this,(vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
                                   *)&local_2c8);
      if (local_309) {
        linb::any::operator=
                  ((any *)&local_228,
                   (vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)
                   &local_2c8);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
        poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_308,"Failed to parse a value of type `{}[]`","");
        local_2d8._M_allocated_capacity._0_4_ = 0x666c6168;
LAB_0031df1c:
        local_2e8._8_8_ = 4;
        local_2d8._M_local_buf[4] = 0;
LAB_0031f775:
        local_2e8._M_allocated_capacity = (size_type)&local_2d8;
        fmt::format<std::__cxx11::string>
                  ((string *)local_2a8,(fmt *)&local_308,(string *)&local_2e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_1e8,(char *)CONCAT44(fStack_2a4,local_2a8),
                             CONCAT44(fStack_29c,fStack_2a0));
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(fStack_2a4,local_2a8) != &aStack_298) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(fStack_2a4,local_2a8),
                          CONCAT44(aStack_298._M_allocated_capacity._4_4_,
                                   aStack_298._M_allocated_capacity._0_4_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e8._M_allocated_capacity != &local_2d8) {
LAB_0031f7db:
          operator_delete((void *)local_2e8._M_allocated_capacity,
                          local_2d8._M_allocated_capacity + 1);
        }
LAB_0031f7e8:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_308._M_dataplus._M_p != &local_308.field_2) {
          operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
        }
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)local_2a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(fStack_2a4,local_2a8) != &aStack_298) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(fStack_2a4,local_2a8),
                          CONCAT44(aStack_298._M_allocated_capacity._4_4_,
                                   aStack_298._M_allocated_capacity._0_4_) + 1);
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1e8);
        ::std::ios_base::~ios_base(local_178);
      }
LAB_0031f85d:
      uVar14 = local_2b8._M_allocated_capacity;
      uVar15 = local_2c8._M_allocated_capacity;
      _local_2a8 = (pointer)CONCAT44(fStack_2a4,local_2a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._M_allocated_capacity !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) goto LAB_0031f86c;
      goto LAB_0031f874;
    }
    bVar7 = ReadBasicType(this,(half *)&local_2c8);
    if (!bVar7) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,"ParseDictElement",0x10);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
      poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
      local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_308,"Failed to parse a value of type `{}`","");
      local_2d8._M_allocated_capacity._0_4_ = 0x666c6168;
      goto LAB_0031dff6;
    }
    linb::any::operator=((any *)&local_228,(half *)&local_2c8);
    break;
  case 0xf:
    if (uVar1 == '[') {
      local_2c8._M_allocated_capacity = 0;
      local_2c8._8_8_ = 0;
      local_2b8._M_allocated_capacity = 0;
      local_309 = ParseBasicTypeArray<int>(this,(vector<int,_std::allocator<int>_> *)&local_2c8);
      if (!local_309) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
        poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_308,"Failed to parse a value of type `{}[]`","");
        local_2e8._M_allocated_capacity = (size_type)&local_2d8;
        local_2d8._M_allocated_capacity._0_4_ = 0x746e69;
        local_2e8._8_8_ = 3;
        fmt::format<std::__cxx11::string>
                  ((string *)local_2a8,(fmt *)&local_308,(string *)&local_2e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_1e8,(char *)CONCAT44(fStack_2a4,local_2a8),
                             CONCAT44(fStack_29c,fStack_2a0));
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(fStack_2a4,local_2a8) != &aStack_298) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(fStack_2a4,local_2a8),
                          CONCAT44(aStack_298._M_allocated_capacity._4_4_,
                                   aStack_298._M_allocated_capacity._0_4_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e8._M_allocated_capacity != &local_2d8) goto LAB_0031f7db;
        goto LAB_0031f7e8;
      }
      linb::any::operator=((any *)&local_228,(vector<int,_std::allocator<int>_> *)&local_2c8);
      goto LAB_0031f85d;
    }
    bVar7 = ReadBasicType(this,(int *)local_2c8._M_local_buf);
    if (!bVar7) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,"ParseDictElement",0x10);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
      poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
      local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_308,"Failed to parse a value of type `{}`","");
      local_2d8._M_allocated_capacity._0_4_ = 0x746e69;
      local_2e8._8_8_ = 3;
      goto LAB_0031f9ea;
    }
    linb::any::operator=((any *)&local_228,(int *)local_2c8._M_local_buf);
    break;
  case 0x10:
    if (uVar1 == '[') {
      local_2c8._M_allocated_capacity = 0;
      local_2c8._8_8_ = 0;
      local_2b8._M_allocated_capacity = 0;
      local_309 = ParseBasicTypeArray<long>(this,(vector<long,_std::allocator<long>_> *)&local_2c8);
      if (!local_309) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
        poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_308,"Failed to parse a value of type `{}[]`","");
        local_2d8._M_allocated_capacity._0_4_ = 0x36746e69;
LAB_0031e0cc:
        local_2d8._M_allocated_capacity._4_2_ = 0x34;
LAB_0031ec6b:
        local_2e8._8_8_ = 5;
        goto LAB_0031f775;
      }
      linb::any::operator=((any *)&local_228,(vector<long,_std::allocator<long>_> *)&local_2c8);
      goto LAB_0031f85d;
    }
    bVar7 = ReadBasicType(this,(int64_t *)local_2c8._M_local_buf);
    if (!bVar7) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,"ParseDictElement",0x10);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
      poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
      local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_308,"Failed to parse a value of type `{}`","");
      local_2d8._M_allocated_capacity._0_4_ = 0x36746e69;
LAB_0031e1a0:
      local_2d8._M_allocated_capacity._4_2_ = 0x34;
LAB_0031ed47:
      local_2e8._8_8_ = 5;
      goto LAB_0031f9ea;
    }
    linb::any::operator=((any *)&local_228,(long *)local_2c8._M_local_buf);
    break;
  case 0x11:
    if (uVar1 == '[') {
      local_2c8._M_allocated_capacity = 0;
      local_2c8._8_8_ = 0;
      local_2b8._M_allocated_capacity = 0;
      local_309 = ParseBasicTypeArray<std::array<tinyusdz::value::half,2ul>>
                            (this,(vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                                   *)&local_2c8);
      if (!local_309) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
        poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_308,"Failed to parse a value of type `{}[]`","");
        local_2d8._M_allocated_capacity._0_4_ = 0x666c6168;
LAB_0031ca0e:
        local_2d8._M_allocated_capacity._4_2_ = 0x32;
        goto LAB_0031ec6b;
      }
      linb::any::operator=
                ((any *)&local_228,
                 (vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                  *)&local_2c8);
      goto LAB_0031f85d;
    }
    bVar7 = ReadBasicType(this,(half2 *)&local_2c8);
    if (!bVar7) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,"ParseDictElement",0x10);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
      poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
      local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_308,"Failed to parse a value of type `{}`","");
      local_2d8._M_allocated_capacity._0_4_ = 0x666c6168;
LAB_0031cae2:
      local_2d8._M_allocated_capacity._4_2_ = 0x32;
      goto LAB_0031ed47;
    }
    linb::any::operator=((any *)&local_228,(array<tinyusdz::value::half,_2UL> *)&local_2c8);
    break;
  case 0x12:
    if (uVar1 == '[') {
      local_2c8._M_allocated_capacity = 0;
      local_2c8._8_8_ = 0;
      local_2b8._M_allocated_capacity = 0;
      local_309 = ParseBasicTypeArray<std::array<tinyusdz::value::half,3ul>>
                            (this,(vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                                   *)&local_2c8);
      if (!local_309) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
        poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_308,"Failed to parse a value of type `{}[]`","");
        local_2d8._M_allocated_capacity._0_4_ = 0x666c6168;
LAB_0031cbb2:
        local_2d8._M_allocated_capacity._4_2_ = 0x33;
        goto LAB_0031ec6b;
      }
      linb::any::operator=
                ((any *)&local_228,
                 (vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                  *)&local_2c8);
      goto LAB_0031f85d;
    }
    bVar7 = ReadBasicType(this,(half3 *)&local_2c8);
    if (!bVar7) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,"ParseDictElement",0x10);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
      poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
      local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_308,"Failed to parse a value of type `{}`","");
      local_2d8._M_allocated_capacity._0_4_ = 0x666c6168;
LAB_0031cc86:
      local_2d8._M_allocated_capacity._4_2_ = 0x33;
      goto LAB_0031ed47;
    }
    primvar::PrimVar::set_value<std::array<tinyusdz::value::half,3ul>>
              ((PrimVar *)&local_228,(array<tinyusdz::value::half,_3UL> *)&local_2c8);
    break;
  case 0x13:
    if (uVar1 == '[') {
      local_2c8._M_allocated_capacity = 0;
      local_2c8._8_8_ = 0;
      local_2b8._M_allocated_capacity = 0;
      local_309 = ParseBasicTypeArray<std::array<tinyusdz::value::half,4ul>>
                            (this,(vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                                   *)&local_2c8);
      if (!local_309) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
        poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_308,"Failed to parse a value of type `{}[]`","");
        local_2d8._M_allocated_capacity._0_4_ = 0x666c6168;
        goto LAB_0031e0cc;
      }
      linb::any::operator=
                ((any *)&local_228,
                 (vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                  *)&local_2c8);
      goto LAB_0031f85d;
    }
    bVar7 = ReadBasicType(this,(half4 *)&local_2c8._M_allocated_capacity);
    if (!bVar7) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,"ParseDictElement",0x10);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
      poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
      local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_308,"Failed to parse a value of type `{}`","");
      local_2d8._M_allocated_capacity._0_4_ = 0x666c6168;
      goto LAB_0031e1a0;
    }
    linb::any::operator=
              ((any *)&local_228,
               (array<tinyusdz::value::half,_4UL> *)&local_2c8._M_allocated_capacity);
    break;
  case 0x14:
    if (uVar1 == '[') {
      local_2c8._M_allocated_capacity = 0;
      local_2c8._8_8_ = 0;
      local_2b8._M_allocated_capacity = 0;
      local_309 = ParseBasicTypeArray<std::array<int,2ul>>
                            (this,(vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>
                                   *)&local_2c8);
      if (!local_309) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
        poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_308,"Failed to parse a value of type `{}[]`","");
        local_2d8._M_allocated_capacity._0_4_ = 0x32746e69;
        goto LAB_0031df1c;
      }
      linb::any::operator=
                ((any *)&local_228,
                 (vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *)&local_2c8)
      ;
      goto LAB_0031f85d;
    }
    bVar7 = ReadBasicType(this,(int2 *)&local_2c8._M_allocated_capacity);
    if (!bVar7) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,"ParseDictElement",0x10);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
      poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
      local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_308,"Failed to parse a value of type `{}`","");
      local_2d8._M_allocated_capacity._0_4_ = 0x32746e69;
      goto LAB_0031dff6;
    }
    linb::any::operator=((any *)&local_228,(array<int,_2UL> *)&local_2c8._M_allocated_capacity);
    break;
  case 0x15:
    if (uVar1 == '[') {
      local_2c8._M_allocated_capacity = 0;
      local_2c8._8_8_ = 0;
      local_2b8._M_allocated_capacity = 0;
      local_309 = ParseBasicTypeArray<std::array<int,3ul>>
                            (this,(vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                                   *)&local_2c8);
      if (!local_309) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
        poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_308,"Failed to parse a value of type `{}[]`","");
        local_2d8._M_allocated_capacity._0_4_ = 0x33746e69;
        goto LAB_0031df1c;
      }
      linb::any::operator=
                ((any *)&local_228,
                 (vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)&local_2c8)
      ;
      goto LAB_0031f85d;
    }
    bVar7 = ReadBasicType(this,(int3 *)&local_2c8);
    if (!bVar7) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,"ParseDictElement",0x10);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
      poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
      local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_308,"Failed to parse a value of type `{}`","");
      local_2d8._M_allocated_capacity._0_4_ = 0x33746e69;
      goto LAB_0031dff6;
    }
    primvar::PrimVar::set_value<std::array<int,3ul>>
              ((PrimVar *)&local_228,(array<int,_3UL> *)&local_2c8);
    break;
  case 0x16:
    if (uVar1 == '[') {
      local_2c8._M_allocated_capacity = 0;
      local_2c8._8_8_ = 0;
      local_2b8._M_allocated_capacity = 0;
      local_309 = ParseBasicTypeArray<std::array<int,4ul>>
                            (this,(vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                                   *)&local_2c8);
      if (!local_309) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
        poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_308,"Failed to parse a value of type `{}[]`","");
        local_2d8._M_allocated_capacity._0_4_ = 0x34746e69;
        goto LAB_0031df1c;
      }
      linb::any::operator=
                ((any *)&local_228,
                 (vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)&local_2c8)
      ;
      goto LAB_0031f85d;
    }
    bVar7 = ReadBasicType(this,(int4 *)&local_2c8);
    if (!bVar7) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,"ParseDictElement",0x10);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
      poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
      local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_308,"Failed to parse a value of type `{}`","");
      local_2d8._M_allocated_capacity._0_4_ = 0x34746e69;
      goto LAB_0031dff6;
    }
    primvar::PrimVar::set_value<std::array<int,4ul>>
              ((PrimVar *)&local_228,(array<int,_4UL> *)&local_2c8);
    break;
  case 0x1b:
    if (uVar1 == '[') {
      local_2c8._M_allocated_capacity = 0;
      local_2c8._8_8_ = 0;
      local_2b8._M_allocated_capacity = 0;
      local_309 = ParseBasicTypeArray<unsigned_int>
                            (this,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_2c8)
      ;
      if (!local_309) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
        poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_308,"Failed to parse a value of type `{}[]`","");
        local_2d8._M_allocated_capacity._0_4_ = 0x746e6975;
        goto LAB_0031df1c;
      }
      linb::any::operator=
                ((any *)&local_228,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_2c8
                );
      goto LAB_0031f85d;
    }
    bVar7 = ReadBasicType(this,(uint32_t *)&local_2c8._M_allocated_capacity);
    if (!bVar7) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,"ParseDictElement",0x10);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
      poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
      local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_308,"Failed to parse a value of type `{}`","");
      local_2d8._M_allocated_capacity._0_4_ = 0x746e6975;
      goto LAB_0031dff6;
    }
    linb::any::operator=((any *)&local_228,(uint *)&local_2c8._M_allocated_capacity);
    break;
  case 0x1c:
    if (uVar1 == '[') {
      local_2c8._M_allocated_capacity = 0;
      local_2c8._8_8_ = 0;
      local_2b8._M_allocated_capacity = 0;
      local_309 = ParseBasicTypeArray<unsigned_long>
                            (this,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                  &local_2c8);
      if (!local_309) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
        poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_308,"Failed to parse a value of type `{}[]`","");
        local_2d8._M_allocated_capacity._0_6_ = 0x3436746e6975;
LAB_0031e903:
        local_2e8._8_8_ = 6;
        local_2d8._M_local_buf[6] = 0;
        goto LAB_0031f775;
      }
      linb::any::operator=
                ((any *)&local_228,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_2c8);
      goto LAB_0031f85d;
    }
    bVar7 = ReadBasicType(this,&local_2c8._M_allocated_capacity);
    if (!bVar7) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,"ParseDictElement",0x10);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
      poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
      local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_308,"Failed to parse a value of type `{}`","");
      local_2d8._M_allocated_capacity._0_6_ = 0x3436746e6975;
LAB_0031e9e3:
      local_2e8._8_8_ = 6;
      local_2d8._M_local_buf[6] = 0;
      goto LAB_0031f9ea;
    }
    linb::any::operator=((any *)&local_228,&local_2c8._M_allocated_capacity);
    break;
  case 0x25:
    if (uVar1 == '[') {
      local_2c8._M_allocated_capacity = 0;
      local_2c8._8_8_ = 0;
      local_2b8._M_allocated_capacity = 0;
      local_309 = ParseBasicTypeArray<std::array<unsigned_int,2ul>>
                            (this,(vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                                   *)&local_2c8);
      if (!local_309) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
        poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_308,"Failed to parse a value of type `{}[]`","");
        local_2d8._M_allocated_capacity._0_4_ = 0x746e6975;
        goto LAB_0031ca0e;
      }
      linb::any::operator=
                ((any *)&local_228,
                 (vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                  *)&local_2c8);
      goto LAB_0031f85d;
    }
    bVar7 = ReadBasicType(this,(uint2 *)&local_2c8._M_allocated_capacity);
    if (!bVar7) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,"ParseDictElement",0x10);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
      poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
      local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_308,"Failed to parse a value of type `{}`","");
      local_2d8._M_allocated_capacity._0_4_ = 0x746e6975;
      goto LAB_0031cae2;
    }
    linb::any::operator=
              ((any *)&local_228,(array<unsigned_int,_2UL> *)&local_2c8._M_allocated_capacity);
    break;
  case 0x26:
    if (uVar1 == '[') {
      local_2c8._M_allocated_capacity = 0;
      local_2c8._8_8_ = 0;
      local_2b8._M_allocated_capacity = 0;
      local_309 = ParseBasicTypeArray<std::array<unsigned_int,3ul>>
                            (this,(vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                                   *)&local_2c8);
      if (!local_309) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
        poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_308,"Failed to parse a value of type `{}[]`","");
        local_2d8._M_allocated_capacity._0_4_ = 0x746e6975;
        goto LAB_0031cbb2;
      }
      linb::any::operator=
                ((any *)&local_228,
                 (vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                  *)&local_2c8);
      goto LAB_0031f85d;
    }
    bVar7 = ReadBasicType(this,(uint3 *)&local_2c8);
    if (!bVar7) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,"ParseDictElement",0x10);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
      poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
      local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_308,"Failed to parse a value of type `{}`","");
      local_2d8._M_allocated_capacity._0_4_ = 0x746e6975;
      goto LAB_0031cc86;
    }
    primvar::PrimVar::set_value<std::array<unsigned_int,3ul>>
              ((PrimVar *)&local_228,(array<unsigned_int,_3UL> *)&local_2c8);
    break;
  case 0x27:
    if (uVar1 == '[') {
      local_2c8._M_allocated_capacity = 0;
      local_2c8._8_8_ = 0;
      local_2b8._M_allocated_capacity = 0;
      local_309 = ParseBasicTypeArray<std::array<unsigned_int,4ul>>
                            (this,(vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                                   *)&local_2c8);
      if (!local_309) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
        poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_308,"Failed to parse a value of type `{}[]`","");
        local_2d8._M_allocated_capacity._0_4_ = 0x746e6975;
        goto LAB_0031e0cc;
      }
      linb::any::operator=
                ((any *)&local_228,
                 (vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                  *)&local_2c8);
      goto LAB_0031f85d;
    }
    bVar7 = ReadBasicType(this,(uint4 *)&local_2c8);
    if (!bVar7) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,"ParseDictElement",0x10);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
      poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
      local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_308,"Failed to parse a value of type `{}`","");
      local_2d8._M_allocated_capacity._0_4_ = 0x746e6975;
      goto LAB_0031e1a0;
    }
    primvar::PrimVar::set_value<std::array<unsigned_int,4ul>>
              ((PrimVar *)&local_228,(array<unsigned_int,_4UL> *)&local_2c8);
    break;
  case 0x28:
    if (uVar1 == '[') {
      local_2c8._M_allocated_capacity = 0;
      local_2c8._8_8_ = 0;
      local_2b8._M_allocated_capacity = 0;
      local_309 = ParseBasicTypeArray<float>
                            (this,(vector<float,_std::allocator<float>_> *)&local_2c8);
      if (!local_309) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
        poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_308,"Failed to parse a value of type `{}[]`","");
        local_2d8._M_allocated_capacity._0_6_ = 0x74616f6c66;
        goto LAB_0031ec6b;
      }
      linb::any::operator=((any *)&local_228,(vector<float,_std::allocator<float>_> *)&local_2c8);
      goto LAB_0031f85d;
    }
    bVar7 = ReadBasicType(this,(float *)&local_2c8);
    if (!bVar7) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,"ParseDictElement",0x10);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
      poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
      local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_308,"Failed to parse a value of type `{}`","");
      local_2d8._M_allocated_capacity._0_6_ = 0x74616f6c66;
      goto LAB_0031ed47;
    }
    linb::any::operator=((any *)&local_228,(float *)&local_2c8);
    break;
  case 0x29:
    if (uVar1 == '[') {
      local_2c8._M_allocated_capacity = 0;
      local_2c8._8_8_ = 0;
      local_2b8._M_allocated_capacity = 0;
      local_309 = ParseBasicTypeArray<std::array<float,2ul>>
                            (this,(vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                                   *)&local_2c8);
      if (!local_309) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
        poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_308,"Failed to parse a value of type `{}[]`","");
        local_2d8._M_allocated_capacity._0_6_ = 0x3274616f6c66;
        goto LAB_0031e903;
      }
      linb::any::operator=
                ((any *)&local_228,
                 (vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)
                 &local_2c8);
      goto LAB_0031f85d;
    }
    bVar7 = ReadBasicType(this,(float2 *)&local_2c8._M_allocated_capacity);
    if (!bVar7) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,"ParseDictElement",0x10);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
      poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
      local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_308,"Failed to parse a value of type `{}`","");
      local_2d8._M_allocated_capacity._0_6_ = 0x3274616f6c66;
      goto LAB_0031e9e3;
    }
    linb::any::operator=((any *)&local_228,(array<float,_2UL> *)&local_2c8._M_allocated_capacity);
    break;
  case 0x2a:
    if (uVar1 == '[') {
      local_2c8._M_allocated_capacity = 0;
      local_2c8._8_8_ = 0;
      local_2b8._M_allocated_capacity = 0;
      local_309 = ParseBasicTypeArray<std::array<float,3ul>>
                            (this,(vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                   *)&local_2c8);
      if (!local_309) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
        poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_308,"Failed to parse a value of type `{}[]`","");
        local_2d8._M_allocated_capacity._0_6_ = 0x3374616f6c66;
        goto LAB_0031e903;
      }
      linb::any::operator=
                ((any *)&local_228,
                 (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                 &local_2c8);
      goto LAB_0031f85d;
    }
    bVar7 = ReadBasicType(this,(float3 *)&local_2c8);
    if (!bVar7) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,"ParseDictElement",0x10);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
      poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
      local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_308,"Failed to parse a value of type `{}`","");
      local_2d8._M_allocated_capacity._0_6_ = 0x3374616f6c66;
      goto LAB_0031e9e3;
    }
    primvar::PrimVar::set_value<std::array<float,3ul>>
              ((PrimVar *)&local_228,(array<float,_3UL> *)&local_2c8);
    break;
  case 0x2b:
    if (uVar1 == '[') {
      local_2c8._M_allocated_capacity = 0;
      local_2c8._8_8_ = 0;
      local_2b8._M_allocated_capacity = 0;
      local_309 = ParseBasicTypeArray<std::array<float,4ul>>
                            (this,(vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                                   *)&local_2c8);
      if (!local_309) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
        poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_308,"Failed to parse a value of type `{}[]`","");
        local_2d8._M_allocated_capacity._0_6_ = 0x3474616f6c66;
        goto LAB_0031e903;
      }
      linb::any::operator=
                ((any *)&local_228,
                 (vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)
                 &local_2c8);
      goto LAB_0031f85d;
    }
    bVar7 = ReadBasicType(this,(float4 *)&local_2c8);
    if (!bVar7) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,"ParseDictElement",0x10);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
      poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
      local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_308,"Failed to parse a value of type `{}`","");
      local_2d8._M_allocated_capacity._0_6_ = 0x3474616f6c66;
      goto LAB_0031e9e3;
    }
    primvar::PrimVar::set_value<std::array<float,4ul>>
              ((PrimVar *)&local_228,(array<float,_4UL> *)&local_2c8);
    break;
  case 0x2c:
    if (uVar1 == '[') {
      local_2c8._M_allocated_capacity = 0;
      local_2c8._8_8_ = 0;
      local_2b8._M_allocated_capacity = 0;
      local_309 = ParseBasicTypeArray<double>
                            (this,(vector<double,_std::allocator<double>_> *)&local_2c8);
      if (!local_309) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
        poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_308,"Failed to parse a value of type `{}[]`","");
        local_2d8._M_allocated_capacity._0_6_ = 0x656c62756f64;
        goto LAB_0031e903;
      }
      linb::any::operator=((any *)&local_228,(vector<double,_std::allocator<double>_> *)&local_2c8);
      goto LAB_0031f85d;
    }
    bVar7 = ReadBasicType(this,(double *)&local_2c8._M_allocated_capacity);
    if (!bVar7) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,"ParseDictElement",0x10);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
      poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
      local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_308,"Failed to parse a value of type `{}`","");
      local_2d8._M_allocated_capacity._0_6_ = 0x656c62756f64;
      goto LAB_0031e9e3;
    }
    linb::any::operator=((any *)&local_228,(double *)&local_2c8._M_allocated_capacity);
    break;
  case 0x2d:
    if (uVar1 == '[') {
      local_2c8._M_allocated_capacity = 0;
      local_2c8._8_8_ = 0;
      local_2b8._M_allocated_capacity = 0;
      local_309 = ParseBasicTypeArray<std::array<double,2ul>>
                            (this,(vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                                   *)&local_2c8);
      if (!local_309) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
        poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_308,"Failed to parse a value of type `{}[]`","");
        local_2d8._M_allocated_capacity = 0x32656c62756f64;
LAB_0031efd2:
        local_2e8._8_8_ = 7;
        goto LAB_0031f775;
      }
      linb::any::operator=
                ((any *)&local_228,
                 (vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
                 &local_2c8);
      goto LAB_0031f85d;
    }
    bVar7 = ReadBasicType(this,(double2 *)&local_2c8);
    if (!bVar7) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,"ParseDictElement",0x10);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
      poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
      local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_308,"Failed to parse a value of type `{}`","");
      local_2d8._M_allocated_capacity = 0x32656c62756f64;
LAB_0031f0b3:
      local_2e8._8_8_ = 7;
      goto LAB_0031f9ea;
    }
    primvar::PrimVar::set_value<std::array<double,2ul>>
              ((PrimVar *)&local_228,(array<double,_2UL> *)&local_2c8);
    break;
  case 0x2e:
    if (uVar1 == '[') {
      local_2c8._M_allocated_capacity = 0;
      local_2c8._8_8_ = 0;
      local_2b8._M_allocated_capacity = 0;
      local_309 = ParseBasicTypeArray<std::array<double,3ul>>
                            (this,(vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                                   *)&local_2c8);
      if (!local_309) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
        poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_308,"Failed to parse a value of type `{}[]`","");
        local_2d8._M_allocated_capacity = 0x33656c62756f64;
        goto LAB_0031efd2;
      }
      linb::any::operator=
                ((any *)&local_228,
                 (vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
                 &local_2c8);
      goto LAB_0031f85d;
    }
    bVar7 = ReadBasicType(this,(double3 *)&local_2c8);
    if (!bVar7) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,"ParseDictElement",0x10);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
      poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
      local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_308,"Failed to parse a value of type `{}`","");
      local_2d8._M_allocated_capacity = 0x33656c62756f64;
      goto LAB_0031f0b3;
    }
    linb::any::operator=((any *)&local_228,(array<double,_3UL> *)&local_2c8);
    break;
  case 0x2f:
    if (uVar1 == '[') {
      local_2c8._M_allocated_capacity = 0;
      local_2c8._8_8_ = 0;
      local_2b8._M_allocated_capacity = 0;
      local_309 = ParseBasicTypeArray<std::array<double,4ul>>
                            (this,(vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                                   *)&local_2c8);
      if (!local_309) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
        poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_308,"Failed to parse a value of type `{}[]`","");
        local_2d8._M_allocated_capacity = 0x34656c62756f64;
        goto LAB_0031efd2;
      }
      linb::any::operator=
                ((any *)&local_228,
                 (vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *)
                 &local_2c8);
      goto LAB_0031f85d;
    }
    bVar7 = ReadBasicType(this,(double4 *)local_2a8);
    if (bVar7) {
      linb::any::operator=((any *)&local_228,(array<double,_4UL> *)local_2a8);
      break;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1e8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1e8,"ParseDictElement",0x10);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
    poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
    local_2e8._M_allocated_capacity = (size_type)&local_2d8;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2e8,"Failed to parse a value of type `{}`","");
    local_2b8._M_allocated_capacity._0_7_ = 0x34656c62756f64;
LAB_0031d739:
    local_2c8._8_8_ = 7;
    local_2b8._M_local_buf[7] = 0;
LAB_0031f26e:
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    fmt::format<std::__cxx11::string>
              ((string *)&local_308,(fmt *)local_2e8._M_local_buf,(string *)&local_2c8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
    poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1e8,local_308._M_dataplus._M_p,local_308._M_string_length
                        );
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_dataplus._M_p != &local_308.field_2) {
      operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_allocated_capacity != &local_2b8) {
      operator_delete((void *)local_2c8._M_allocated_capacity,local_2b8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_allocated_capacity != &local_2d8) {
      operator_delete((void *)local_2e8._M_allocated_capacity,local_2d8._M_allocated_capacity + 1);
    }
    ::std::__cxx11::stringbuf::str();
    PushError(this,&local_308);
    uVar15 = local_308.field_2._M_allocated_capacity;
    _Var16._M_p = local_308._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_dataplus._M_p != &local_308.field_2) goto LAB_0031faa3;
    goto LAB_0031faab;
  case 0x30:
    if (uVar1 == '[') {
      local_2c8._M_allocated_capacity = 0;
      local_2c8._8_8_ = 0;
      local_2b8._M_allocated_capacity = 0;
      local_309 = ParseBasicTypeArray<tinyusdz::value::quath>
                            (this,(vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                                   *)&local_2c8);
      if (!local_309) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
        poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_308,"Failed to parse a value of type `{}[]`","");
        local_2d8._M_allocated_capacity._0_6_ = 0x6874617571;
        goto LAB_0031ec6b;
      }
      linb::any::operator=
                ((any *)&local_228,
                 (vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *)
                 &local_2c8);
      goto LAB_0031f85d;
    }
    bVar7 = ReadBasicType(this,(quath *)&local_2c8._M_allocated_capacity);
    if (!bVar7) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,"ParseDictElement",0x10);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
      poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
      local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_308,"Failed to parse a value of type `{}`","");
      local_2d8._M_allocated_capacity._0_6_ = 0x6874617571;
      goto LAB_0031ed47;
    }
    linb::any::operator=((any *)&local_228,(quath *)&local_2c8._M_allocated_capacity);
    break;
  case 0x31:
    if (uVar1 == '[') {
      local_2c8._M_allocated_capacity = 0;
      local_2c8._8_8_ = 0;
      local_2b8._M_allocated_capacity = 0;
      local_309 = ParseBasicTypeArray<tinyusdz::value::quatf>
                            (this,(vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                                   *)&local_2c8);
      if (!local_309) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
        poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_308,"Failed to parse a value of type `{}[]`","");
        local_2d8._M_allocated_capacity._0_6_ = 0x6674617571;
        goto LAB_0031ec6b;
      }
      linb::any::operator=
                ((any *)&local_228,
                 (vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)
                 &local_2c8);
      goto LAB_0031f85d;
    }
    bVar7 = ReadBasicType(this,(quatf *)&local_2c8);
    if (!bVar7) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,"ParseDictElement",0x10);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
      poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
      local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_308,"Failed to parse a value of type `{}`","");
      local_2d8._M_allocated_capacity._0_6_ = 0x6674617571;
      goto LAB_0031ed47;
    }
    primvar::PrimVar::set_value<tinyusdz::value::quatf>((PrimVar *)&local_228,(quatf *)&local_2c8);
    break;
  case 0x32:
    if (uVar1 == '[') {
      local_2c8._M_allocated_capacity = 0;
      local_2c8._8_8_ = 0;
      local_2b8._M_allocated_capacity = 0;
      local_309 = ParseBasicTypeArray<tinyusdz::value::quatd>
                            (this,(vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>
                                   *)&local_2c8);
      if (!local_309) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
        poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_308,"Failed to parse a value of type `{}[]`","");
        local_2d8._M_allocated_capacity._0_6_ = 0x6474617571;
        goto LAB_0031ec6b;
      }
      linb::any::operator=
                ((any *)&local_228,
                 (vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> *)
                 &local_2c8);
      goto LAB_0031f85d;
    }
    bVar7 = ReadBasicType(this,(quatd *)local_2a8);
    if (!bVar7) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,"ParseDictElement",0x10);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
      poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
      local_2e8._M_allocated_capacity = (size_type)&local_2d8;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2e8,"Failed to parse a value of type `{}`","");
      local_2b8._M_allocated_capacity._0_6_ = 0x6474617571;
      local_2c8._8_8_ = 5;
      goto LAB_0031f26e;
    }
    linb::any::operator=((any *)&local_228,(quatd *)local_2a8);
    break;
  case 0x33:
    if (uVar1 == '[') {
      local_2c8._M_allocated_capacity = 0;
      local_2c8._8_8_ = 0;
      local_2b8._M_allocated_capacity = 0;
      local_309 = ParseBasicTypeArray<tinyusdz::value::matrix2f>
                            (this,(vector<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_>
                                   *)&local_2c8);
      if (!local_309) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
        poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_308,"Failed to parse a value of type `{}[]`","");
        local_2d8._M_allocated_capacity = 0x663278697274616d;
LAB_0031f5a2:
        local_2e8._8_8_ = 8;
        local_2d8._8_2_ = (ushort)(byte)local_2d8._M_local_buf[9] << 8;
        goto LAB_0031f775;
      }
      linb::any::operator=
                ((any *)&local_228,
                 (vector<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_> *)
                 &local_2c8);
      goto LAB_0031f85d;
    }
    local_2c8._M_allocated_capacity = 0x3f800000;
    local_2c8._8_8_ = 0x3f80000000000000;
    bVar7 = ReadBasicType(this,(matrix2f *)&local_2c8);
    if (!bVar7) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,"ParseDictElement",0x10);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
      poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
      local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_308,"Failed to parse a value of type `{}`","");
      local_2d8._M_allocated_capacity = 0x663278697274616d;
LAB_0031f682:
      local_2e8._8_8_ = 8;
      local_2d8._8_2_ = (ushort)(byte)local_2d8._M_local_buf[9] << 8;
      goto LAB_0031f9ea;
    }
    primvar::PrimVar::set_value<tinyusdz::value::matrix2f>
              ((PrimVar *)&local_228,(matrix2f *)&local_2c8);
    break;
  case 0x34:
    if (uVar1 == '[') {
      local_2c8._M_allocated_capacity = 0;
      local_2c8._8_8_ = 0;
      local_2b8._M_allocated_capacity = 0;
      local_309 = ParseBasicTypeArray<tinyusdz::value::matrix3f>
                            (this,(vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>
                                   *)&local_2c8);
      if (!local_309) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
        poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_308,"Failed to parse a value of type `{}[]`","");
        local_2d8._M_allocated_capacity = 0x663378697274616d;
        goto LAB_0031f5a2;
      }
      linb::any::operator=
                ((any *)&local_228,
                 (vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_> *)
                 &local_2c8);
      goto LAB_0031f85d;
    }
    local_2a8 = (undefined1  [4])0x3f800000;
    fStack_2a4 = 0.0;
    fStack_2a0 = 0.0;
    fStack_29c = 0.0;
    aStack_298._M_allocated_capacity._0_4_ = 0x3f800000;
    aStack_298._M_allocated_capacity._4_4_ = 0;
    aStack_298._8_8_ = (float *)0x0;
    uStack_288._0_1_ = false;
    uStack_288._1_1_ = false;
    uStack_286 = 0x3f80;
    bVar7 = ReadBasicType(this,(matrix3f *)local_2a8);
    if (!bVar7) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,"ParseDictElement",0x10);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
      poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
      local_2e8._M_allocated_capacity = (size_type)&local_2d8;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2e8,"Failed to parse a value of type `{}`","");
      local_2b8._M_allocated_capacity = 0x663378697274616d;
LAB_0031f25e:
      local_2c8._8_8_ = 8;
      local_2b8._M_local_buf[8] = '\0';
      goto LAB_0031f26e;
    }
    linb::any::operator=((any *)&local_228,(matrix3f *)local_2a8);
    break;
  case 0x35:
    if (uVar1 == '[') {
      local_2c8._M_allocated_capacity = 0;
      local_2c8._8_8_ = 0;
      local_2b8._M_allocated_capacity = 0;
      local_309 = ParseBasicTypeArray<tinyusdz::value::matrix4f>
                            (this,(vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>
                                   *)&local_2c8);
      if (!local_309) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
        poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_308,"Failed to parse a value of type `{}[]`","");
        local_2d8._M_allocated_capacity = 0x663478697274616d;
        goto LAB_0031f5a2;
      }
      linb::any::operator=
                ((any *)&local_228,
                 (vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_> *)
                 &local_2c8);
      goto LAB_0031f85d;
    }
    local_2a8 = (undefined1  [4])0x3f800000;
    fStack_2a4 = 0.0;
    fStack_2a0 = 0.0;
    fStack_29c = 0.0;
    aStack_298._M_allocated_capacity._0_4_ = 0;
    aStack_298._M_allocated_capacity._4_4_ = 0x3f800000;
    aStack_298._8_8_ = (float *)0x0;
    uStack_288._0_1_ = false;
    uStack_288._1_1_ = false;
    uStack_286 = 0;
    fStack_284 = 0.0;
    local_280 = 1.0;
    fStack_27c = 0.0;
    aStack_278._M_allocated_capacity._0_4_ = 0;
    aStack_278._M_allocated_capacity._4_4_ = 0;
    aStack_278._8_4_ = 0;
    aStack_278._12_4_ = 0x3f800000;
    bVar7 = ReadBasicType(this,(matrix4f *)local_2a8);
    if (!bVar7) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,"ParseDictElement",0x10);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
      poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
      local_2e8._M_allocated_capacity = (size_type)&local_2d8;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2e8,"Failed to parse a value of type `{}`","");
      local_2b8._M_allocated_capacity = 0x663478697274616d;
      goto LAB_0031f25e;
    }
    linb::any::operator=((any *)&local_228,(matrix4f *)local_2a8);
    break;
  case 0x36:
    if (uVar1 == '[') {
      local_2c8._M_allocated_capacity = 0;
      local_2c8._8_8_ = 0;
      local_2b8._M_allocated_capacity = 0;
      local_309 = ParseBasicTypeArray<tinyusdz::value::matrix2d>
                            (this,(vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>
                                   *)&local_2c8);
      if (!local_309) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
        poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_308,"Failed to parse a value of type `{}[]`","");
        local_2d8._M_allocated_capacity = 0x643278697274616d;
        goto LAB_0031f5a2;
      }
      linb::any::operator=
                ((any *)&local_228,
                 (vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_> *)
                 &local_2c8);
      goto LAB_0031f85d;
    }
    local_2a8 = (undefined1  [4])0x0;
    fStack_2a4 = 1.875;
    fStack_2a0 = 0.0;
    fStack_29c = 0.0;
    aStack_298._M_allocated_capacity._0_4_ = 0;
    aStack_298._M_allocated_capacity._4_4_ = 0;
    aStack_298._8_8_ = (float *)0x3ff0000000000000;
    bVar7 = ReadBasicType(this,(matrix2d *)local_2a8);
    if (!bVar7) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,"ParseDictElement",0x10);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
      poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
      local_2e8._M_allocated_capacity = (size_type)&local_2d8;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2e8,"Failed to parse a value of type `{}`","");
      local_2b8._M_allocated_capacity = 0x643278697274616d;
      goto LAB_0031f25e;
    }
    linb::any::operator=((any *)&local_228,(matrix2d *)local_2a8);
    break;
  case 0x37:
    if (uVar1 == '[') {
      local_2c8._M_allocated_capacity = 0;
      local_2c8._8_8_ = 0;
      local_2b8._M_allocated_capacity = 0;
      local_309 = ParseBasicTypeArray<tinyusdz::value::matrix3d>
                            (this,(vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
                                   *)&local_2c8);
      if (!local_309) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
        poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_308,"Failed to parse a value of type `{}[]`","");
        local_2d8._M_allocated_capacity = 0x643378697274616d;
        goto LAB_0031f5a2;
      }
      linb::any::operator=
                ((any *)&local_228,
                 (vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_> *)
                 &local_2c8);
      goto LAB_0031f85d;
    }
    local_2a8 = (undefined1  [4])0x0;
    fStack_2a4 = 1.875;
    fStack_2a0 = 0.0;
    fStack_29c = 0.0;
    aStack_298._M_allocated_capacity._0_4_ = 0;
    aStack_298._M_allocated_capacity._4_4_ = 0;
    args = (uint *)0x0;
    aStack_298._8_8_ = (float *)0x0;
    uStack_288._0_1_ = false;
    uStack_288._1_1_ = false;
    uStack_286 = 0;
    fStack_284 = 1.875;
    local_280 = 0.0;
    fStack_27c = 0.0;
    aStack_278._M_allocated_capacity._0_4_ = 0;
    aStack_278._M_allocated_capacity._4_4_ = 0;
    aStack_278._8_4_ = 0;
    aStack_278._12_4_ = 0;
    local_268 = 1.0;
    bVar7 = ReadBasicType(this,(matrix3d *)local_2a8);
    if (!bVar7) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,"ParseDictElement",0x10);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
      poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
      local_2e8._M_allocated_capacity = (size_type)&local_2d8;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2e8,"Failed to parse a value of type `{}`","");
      local_2b8._M_allocated_capacity = 0x643378697274616d;
      goto LAB_0031f25e;
    }
    linb::any::operator=((any *)&local_228,(matrix3d *)local_2a8);
    break;
  case 0x38:
    if (uVar1 == '[') {
      local_2c8._M_allocated_capacity = 0;
      local_2c8._8_8_ = 0;
      local_2b8._M_allocated_capacity = 0;
      local_309 = ParseBasicTypeArray<tinyusdz::value::matrix4d>
                            (this,(vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                                   *)&local_2c8);
      if (!local_309) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
        poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_308,"Failed to parse a value of type `{}[]`","");
        local_2d8._M_allocated_capacity = 0x643478697274616d;
        goto LAB_0031f5a2;
      }
      linb::any::operator=
                ((any *)&local_228,
                 (vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> *)
                 &local_2c8);
      goto LAB_0031f85d;
    }
    local_2a8 = (undefined1  [4])0x0;
    fStack_2a4 = 1.875;
    fStack_2a0 = 0.0;
    fStack_29c = 0.0;
    aStack_298._M_allocated_capacity._0_4_ = 0;
    aStack_298._M_allocated_capacity._4_4_ = 0;
    aStack_298._8_8_ = (float *)0x0;
    uStack_288._0_1_ = false;
    uStack_288._1_1_ = false;
    uStack_286 = 0;
    fStack_284 = 0.0;
    local_280 = 0.0;
    fStack_27c = 1.875;
    aStack_278._M_allocated_capacity._0_4_ = 0;
    aStack_278._M_allocated_capacity._4_4_ = 0;
    aStack_278._8_4_ = 0;
    aStack_278._12_4_ = 0;
    local_268 = 0.0;
    dStack_260 = 0.0;
    local_258 = 1.0;
    local_250 = 0.0;
    dStack_248 = 0.0;
    local_240 = 0.0;
    dStack_238 = 0.0;
    local_230 = 1.0;
    bVar7 = ReadBasicType(this,(matrix4d *)local_2a8);
    if (!bVar7) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,"ParseDictElement",0x10);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
      poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
      local_2e8._M_allocated_capacity = (size_type)&local_2d8;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2e8,"Failed to parse a value of type `{}`","");
      local_2b8._M_allocated_capacity = 0x643478697274616d;
      goto LAB_0031f25e;
    }
    linb::any::operator=((any *)&local_228,(matrix4d *)local_2a8);
    break;
  case 0x3a:
    if (uVar1 == '[') {
      local_2c8._M_allocated_capacity = 0;
      local_2c8._8_8_ = 0;
      local_2b8._M_allocated_capacity = 0;
      local_309 = ParseBasicTypeArray<tinyusdz::value::color3f>
                            (this,(vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                                   *)&local_2c8);
      if (!local_309) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
        poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_308,"Failed to parse a value of type `{}[]`","");
        local_2d8._M_allocated_capacity = 0x6633726f6c6f63;
        goto LAB_0031efd2;
      }
      linb::any::operator=
                ((any *)&local_228,
                 (vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> *)
                 &local_2c8);
      goto LAB_0031f85d;
    }
    bVar7 = ReadBasicType(this,(color3f *)&local_2c8);
    if (!bVar7) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,"ParseDictElement",0x10);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
      poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
      local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_308,"Failed to parse a value of type `{}`","");
      local_2d8._M_allocated_capacity = 0x6633726f6c6f63;
      goto LAB_0031f0b3;
    }
    primvar::PrimVar::set_value<tinyusdz::value::color3f>
              ((PrimVar *)&local_228,(color3f *)&local_2c8);
    break;
  case 0x3b:
    if (uVar1 == '[') {
      local_2c8._M_allocated_capacity = 0;
      local_2c8._8_8_ = 0;
      local_2b8._M_allocated_capacity = 0;
      local_309 = ParseBasicTypeArray<tinyusdz::value::color3d>
                            (this,(vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                                   *)&local_2c8);
      if (!local_309) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
        poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_308,"Failed to parse a value of type `{}[]`","");
        local_2d8._M_allocated_capacity = 0x6433726f6c6f63;
        goto LAB_0031efd2;
      }
      linb::any::operator=
                ((any *)&local_228,
                 (vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> *)
                 &local_2c8);
      goto LAB_0031f85d;
    }
    bVar7 = ReadBasicType(this,(color3d *)&local_2c8);
    if (!bVar7) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,"ParseDictElement",0x10);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
      poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
      local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_308,"Failed to parse a value of type `{}`","");
      local_2d8._M_allocated_capacity = 0x6433726f6c6f63;
      goto LAB_0031f0b3;
    }
    linb::any::operator=((any *)&local_228,(color3d *)&local_2c8);
    break;
  case 0x3d:
    if (uVar1 == '[') {
      local_2c8._M_allocated_capacity = 0;
      local_2c8._8_8_ = 0;
      local_2b8._M_allocated_capacity = 0;
      local_309 = ParseBasicTypeArray<tinyusdz::value::color4f>
                            (this,(vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                                   *)&local_2c8);
      if (!local_309) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
        poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_308,"Failed to parse a value of type `{}[]`","");
        local_2d8._M_allocated_capacity = 0x6634726f6c6f63;
        goto LAB_0031efd2;
      }
      linb::any::operator=
                ((any *)&local_228,
                 (vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_> *)
                 &local_2c8);
      goto LAB_0031f85d;
    }
    bVar7 = ReadBasicType(this,(color4f *)&local_2c8);
    if (!bVar7) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,"ParseDictElement",0x10);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
      poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
      local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_308,"Failed to parse a value of type `{}`","");
      local_2d8._M_allocated_capacity = 0x6634726f6c6f63;
      goto LAB_0031f0b3;
    }
    primvar::PrimVar::set_value<tinyusdz::value::color4f>
              ((PrimVar *)&local_228,(color4f *)&local_2c8);
    break;
  case 0x3e:
    if (uVar1 == '[') {
      local_2c8._M_allocated_capacity = 0;
      local_2c8._8_8_ = 0;
      local_2b8._M_allocated_capacity = 0;
      local_309 = ParseBasicTypeArray<tinyusdz::value::color4d>
                            (this,(vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                                   *)&local_2c8);
      if (!local_309) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
        poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_308,"Failed to parse a value of type `{}[]`","");
        local_2d8._M_allocated_capacity = 0x6434726f6c6f63;
        goto LAB_0031efd2;
      }
      linb::any::operator=
                ((any *)&local_228,
                 (vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> *)
                 &local_2c8);
      goto LAB_0031f85d;
    }
    bVar7 = ReadBasicType(this,(color4d *)local_2a8);
    if (!bVar7) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,"ParseDictElement",0x10);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
      poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
      local_2e8._M_allocated_capacity = (size_type)&local_2d8;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2e8,"Failed to parse a value of type `{}`","");
      local_2b8._M_allocated_capacity._0_7_ = 0x6434726f6c6f63;
      goto LAB_0031d739;
    }
    linb::any::operator=((any *)&local_228,(color4d *)local_2a8);
    break;
  case 0x3f:
    if (uVar1 == '[') {
      local_2c8._M_allocated_capacity = 0;
      local_2c8._8_8_ = 0;
      local_2b8._M_allocated_capacity = 0;
      local_309 = ParseBasicTypeArray<tinyusdz::value::point3h>
                            (this,(vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>
                                   *)&local_2c8);
      if (!local_309) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
        poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_308,"Failed to parse a value of type `{}[]`","");
        local_2d8._M_allocated_capacity = 0x6833746e696f70;
        goto LAB_0031efd2;
      }
      linb::any::operator=
                ((any *)&local_228,
                 (vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_> *)
                 &local_2c8);
      goto LAB_0031f85d;
    }
    bVar7 = ReadBasicType(this,(point3h *)&local_2c8);
    if (!bVar7) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,"ParseDictElement",0x10);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
      poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
      local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_308,"Failed to parse a value of type `{}`","");
      local_2d8._M_allocated_capacity = 0x6833746e696f70;
      goto LAB_0031f0b3;
    }
    primvar::PrimVar::set_value<tinyusdz::value::point3h>
              ((PrimVar *)&local_228,(point3h *)&local_2c8);
    break;
  case 0x40:
    if (uVar1 == '[') {
      local_2c8._M_allocated_capacity = 0;
      local_2c8._8_8_ = 0;
      local_2b8._M_allocated_capacity = 0;
      local_309 = ParseBasicTypeArray<tinyusdz::value::point3f>
                            (this,(vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                                   *)&local_2c8);
      if (!local_309) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
        poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_308,"Failed to parse a value of type `{}[]`","");
        local_2d8._M_allocated_capacity = 0x6633746e696f70;
        goto LAB_0031efd2;
      }
      linb::any::operator=
                ((any *)&local_228,
                 (vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *)
                 &local_2c8);
      goto LAB_0031f85d;
    }
    bVar7 = ReadBasicType(this,(point3f *)&local_2c8);
    if (!bVar7) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,"ParseDictElement",0x10);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
      poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
      local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_308,"Failed to parse a value of type `{}`","");
      local_2d8._M_allocated_capacity = 0x6633746e696f70;
      goto LAB_0031f0b3;
    }
    primvar::PrimVar::set_value<tinyusdz::value::point3f>
              ((PrimVar *)&local_228,(point3f *)&local_2c8);
    break;
  case 0x41:
    if (uVar1 == '[') {
      local_2c8._M_allocated_capacity = 0;
      local_2c8._8_8_ = 0;
      local_2b8._M_allocated_capacity = 0;
      local_309 = ParseBasicTypeArray<tinyusdz::value::point3d>
                            (this,(vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
                                   *)&local_2c8);
      if (!local_309) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
        poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_308,"Failed to parse a value of type `{}[]`","");
        local_2d8._M_allocated_capacity = 0x6433746e696f70;
        goto LAB_0031efd2;
      }
      linb::any::operator=
                ((any *)&local_228,
                 (vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_> *)
                 &local_2c8);
      goto LAB_0031f85d;
    }
    bVar7 = ReadBasicType(this,(point3d *)&local_2c8);
    if (!bVar7) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,"ParseDictElement",0x10);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
      poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
      local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_308,"Failed to parse a value of type `{}`","");
      local_2d8._M_allocated_capacity = 0x6433746e696f70;
      goto LAB_0031f0b3;
    }
    linb::any::operator=((any *)&local_228,(point3d *)&local_2c8);
    break;
  case 0x42:
    if (uVar1 == '[') {
      local_2c8._M_allocated_capacity = 0;
      local_2c8._8_8_ = 0;
      local_2b8._M_allocated_capacity = 0;
      local_309 = ParseBasicTypeArray<tinyusdz::value::normal3h>
                            (this,(vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
                                   *)&local_2c8);
      if (!local_309) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
        poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_308,"Failed to parse a value of type `{}[]`","");
        local_2d8._M_allocated_capacity = 0x68336c616d726f6e;
        goto LAB_0031f5a2;
      }
      linb::any::operator=
                ((any *)&local_228,
                 (vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_> *)
                 &local_2c8);
      goto LAB_0031f85d;
    }
    bVar7 = ReadBasicType(this,(normal3h *)&local_2c8);
    if (!bVar7) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,"ParseDictElement",0x10);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
      poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
      local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_308,"Failed to parse a value of type `{}`","");
      local_2d8._M_allocated_capacity = 0x68336c616d726f6e;
      goto LAB_0031f682;
    }
    primvar::PrimVar::set_value<tinyusdz::value::normal3h>
              ((PrimVar *)&local_228,(normal3h *)&local_2c8);
    break;
  case 0x43:
    if (uVar1 == '[') {
      local_2c8._M_allocated_capacity = 0;
      local_2c8._8_8_ = 0;
      local_2b8._M_allocated_capacity = 0;
      local_309 = ParseBasicTypeArray<tinyusdz::value::normal3f>
                            (this,(vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                   *)&local_2c8);
      if (!local_309) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
        poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_308,"Failed to parse a value of type `{}[]`","");
        local_2d8._M_allocated_capacity = 0x66336c616d726f6e;
        goto LAB_0031f5a2;
      }
      linb::any::operator=
                ((any *)&local_228,
                 (vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *)
                 &local_2c8);
      goto LAB_0031f85d;
    }
    bVar7 = ReadBasicType(this,(normal3f *)&local_2c8);
    if (!bVar7) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,"ParseDictElement",0x10);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
      poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
      local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_308,"Failed to parse a value of type `{}`","");
      local_2d8._M_allocated_capacity = 0x66336c616d726f6e;
      goto LAB_0031f682;
    }
    primvar::PrimVar::set_value<tinyusdz::value::normal3f>
              ((PrimVar *)&local_228,(normal3f *)&local_2c8);
    break;
  case 0x44:
    if (uVar1 == '[') {
      local_2c8._M_allocated_capacity = 0;
      local_2c8._8_8_ = 0;
      local_2b8._M_allocated_capacity = 0;
      local_309 = ParseBasicTypeArray<tinyusdz::value::normal3d>
                            (this,(vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>
                                   *)&local_2c8);
      if (!local_309) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
        poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_308,"Failed to parse a value of type `{}[]`","");
        local_2d8._M_allocated_capacity = 0x64336c616d726f6e;
        goto LAB_0031f5a2;
      }
      linb::any::operator=
                ((any *)&local_228,
                 (vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_> *)
                 &local_2c8);
      goto LAB_0031f85d;
    }
    bVar7 = ReadBasicType(this,(normal3d *)&local_2c8);
    if (!bVar7) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,"ParseDictElement",0x10);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
      poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
      local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_308,"Failed to parse a value of type `{}`","");
      local_2d8._M_allocated_capacity = 0x64336c616d726f6e;
      goto LAB_0031f682;
    }
    linb::any::operator=((any *)&local_228,(normal3d *)&local_2c8);
    break;
  case 0x45:
    if (uVar1 == '[') {
      local_2c8._M_allocated_capacity = 0;
      local_2c8._8_8_ = 0;
      local_2b8._M_allocated_capacity = 0;
      local_309 = ParseBasicTypeArray<tinyusdz::value::vector3h>
                            (this,(vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>
                                   *)&local_2c8);
      if (!local_309) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
        poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_308,"Failed to parse a value of type `{}[]`","");
        local_2d8._M_allocated_capacity = 0x6833726f74636576;
        goto LAB_0031f5a2;
      }
      linb::any::operator=
                ((any *)&local_228,
                 (vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_> *)
                 &local_2c8);
      goto LAB_0031f85d;
    }
    bVar7 = ReadBasicType(this,(vector3h *)&local_2c8);
    if (!bVar7) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,"ParseDictElement",0x10);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
      poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
      local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_308,"Failed to parse a value of type `{}`","");
      local_2d8._M_allocated_capacity = 0x6833726f74636576;
      goto LAB_0031f682;
    }
    primvar::PrimVar::set_value<tinyusdz::value::vector3h>
              ((PrimVar *)&local_228,(vector3h *)&local_2c8);
    break;
  case 0x46:
    if (uVar1 == '[') {
      local_2c8._M_allocated_capacity = 0;
      local_2c8._8_8_ = 0;
      local_2b8._M_allocated_capacity = 0;
      local_309 = ParseBasicTypeArray<tinyusdz::value::vector3f>
                            (this,(vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                                   *)&local_2c8);
      if (!local_309) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
        poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_308,"Failed to parse a value of type `{}[]`","");
        local_2d8._M_allocated_capacity = 0x6633726f74636576;
        goto LAB_0031f5a2;
      }
      linb::any::operator=
                ((any *)&local_228,
                 (vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_> *)
                 &local_2c8);
      goto LAB_0031f85d;
    }
    bVar7 = ReadBasicType(this,(vector3f *)&local_2c8);
    if (!bVar7) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,"ParseDictElement",0x10);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
      poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
      local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_308,"Failed to parse a value of type `{}`","");
      local_2d8._M_allocated_capacity = 0x6633726f74636576;
      goto LAB_0031f682;
    }
    primvar::PrimVar::set_value<tinyusdz::value::vector3f>
              ((PrimVar *)&local_228,(vector3f *)&local_2c8);
    break;
  case 0x47:
    if (uVar1 == '[') {
      local_2c8._M_allocated_capacity = 0;
      local_2c8._8_8_ = 0;
      local_2b8._M_allocated_capacity = 0;
      local_309 = ParseBasicTypeArray<tinyusdz::value::vector3d>
                            (this,(vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>
                                   *)&local_2c8);
      if (!local_309) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
        poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_308,"Failed to parse a value of type `{}[]`","");
        local_2d8._M_allocated_capacity = 0x6433726f74636576;
        goto LAB_0031f5a2;
      }
      linb::any::operator=
                ((any *)&local_228,
                 (vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_> *)
                 &local_2c8);
      goto LAB_0031f85d;
    }
    bVar7 = ReadBasicType(this,(vector3d *)&local_2c8);
    if (!bVar7) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,"ParseDictElement",0x10);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
      poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
      local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_308,"Failed to parse a value of type `{}`","");
      local_2d8._M_allocated_capacity = 0x6433726f74636576;
      goto LAB_0031f682;
    }
    linb::any::operator=((any *)&local_228,(vector3d *)&local_2c8);
    break;
  case 0x49:
    if (uVar1 == '[') {
      local_2c8._M_allocated_capacity = 0;
      local_2c8._8_8_ = 0;
      local_2b8._M_allocated_capacity = 0;
      local_309 = ParseBasicTypeArray<tinyusdz::value::texcoord2h>
                            (this,(vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                                   *)&local_2c8);
      if (!local_309) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
        poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_308,"Failed to parse a value of type `{}[]`","");
        local_2d8._8_2_ = 0x6832;
LAB_0031f769:
        local_2d8._M_allocated_capacity = 0x64726f6f43786574;
        local_2e8._8_8_ = 10;
        local_2d8._M_local_buf[10] = '\0';
        goto LAB_0031f775;
      }
      linb::any::operator=
                ((any *)&local_228,
                 (vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                  *)&local_2c8);
      goto LAB_0031f85d;
    }
    bVar7 = ReadBasicType(this,(texcoord2h *)&local_2c8);
    if (!bVar7) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,"ParseDictElement",0x10);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
      poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
      local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_308,"Failed to parse a value of type `{}`","");
      local_2d8._8_2_ = 0x6832;
LAB_0031f9de:
      local_2d8._M_allocated_capacity = 0x64726f6f43786574;
      local_2e8._8_8_ = 10;
      local_2d8._M_local_buf[10] = '\0';
      goto LAB_0031f9ea;
    }
    linb::any::operator=((any *)&local_228,(texcoord2h *)&local_2c8);
    break;
  case 0x4a:
    if (uVar1 == '[') {
      local_2c8._M_allocated_capacity = 0;
      local_2c8._8_8_ = 0;
      local_2b8._M_allocated_capacity = 0;
      local_309 = ParseBasicTypeArray<tinyusdz::value::texcoord2f>
                            (this,(vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                                   *)&local_2c8);
      if (!local_309) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
        poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_308,"Failed to parse a value of type `{}[]`","");
        local_2d8._8_2_ = 0x6632;
        goto LAB_0031f769;
      }
      linb::any::operator=
                ((any *)&local_228,
                 (vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                  *)&local_2c8);
      goto LAB_0031f85d;
    }
    bVar7 = ReadBasicType(this,(texcoord2f *)&local_2c8._M_allocated_capacity);
    if (!bVar7) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,"ParseDictElement",0x10);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
      poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
      local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_308,"Failed to parse a value of type `{}`","");
      local_2d8._8_2_ = 0x6632;
      goto LAB_0031f9de;
    }
    linb::any::operator=((any *)&local_228,(texcoord2f *)&local_2c8._M_allocated_capacity);
    break;
  case 0x4b:
    if (uVar1 == '[') {
      local_2c8._M_allocated_capacity = 0;
      local_2c8._8_8_ = 0;
      local_2b8._M_allocated_capacity = 0;
      local_309 = ParseBasicTypeArray<tinyusdz::value::texcoord2d>
                            (this,(vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                                   *)&local_2c8);
      if (!local_309) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
        poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_308,"Failed to parse a value of type `{}[]`","");
        local_2d8._8_2_ = 0x6432;
        goto LAB_0031f769;
      }
      linb::any::operator=
                ((any *)&local_228,
                 (vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                  *)&local_2c8);
      goto LAB_0031f85d;
    }
    bVar7 = ReadBasicType(this,(texcoord2d *)&local_2c8);
    if (!bVar7) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,"ParseDictElement",0x10);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
      poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
      local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_308,"Failed to parse a value of type `{}`","");
      local_2d8._8_2_ = 0x6432;
      goto LAB_0031f9de;
    }
    primvar::PrimVar::set_value<tinyusdz::value::texcoord2d>
              ((PrimVar *)&local_228,(texcoord2d *)&local_2c8);
    break;
  case 0x4c:
    if (uVar1 == '[') {
      local_2c8._M_allocated_capacity = 0;
      local_2c8._8_8_ = 0;
      local_2b8._M_allocated_capacity = 0;
      local_309 = ParseBasicTypeArray<tinyusdz::value::texcoord3h>
                            (this,(vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                                   *)&local_2c8);
      if (!local_309) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
        poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_308,"Failed to parse a value of type `{}[]`","");
        local_2d8._8_2_ = 0x6833;
        goto LAB_0031f769;
      }
      linb::any::operator=
                ((any *)&local_228,
                 (vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                  *)&local_2c8);
      goto LAB_0031f85d;
    }
    bVar7 = ReadBasicType(this,(texcoord3h *)&local_2c8);
    if (!bVar7) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,"ParseDictElement",0x10);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
      poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
      local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_308,"Failed to parse a value of type `{}`","");
      local_2d8._8_2_ = 0x6833;
      goto LAB_0031f9de;
    }
    primvar::PrimVar::set_value<tinyusdz::value::texcoord3h>
              ((PrimVar *)&local_228,(texcoord3h *)&local_2c8);
    break;
  case 0x4d:
    if (uVar1 == '[') {
      local_2c8._M_allocated_capacity = 0;
      local_2c8._8_8_ = 0;
      local_2b8._M_allocated_capacity = 0;
      local_309 = ParseBasicTypeArray<tinyusdz::value::texcoord3f>
                            (this,(vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                                   *)&local_2c8);
      if (!local_309) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
        poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_308,"Failed to parse a value of type `{}[]`","");
        local_2d8._8_2_ = 0x6633;
        goto LAB_0031f769;
      }
      linb::any::operator=
                ((any *)&local_228,
                 (vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                  *)&local_2c8);
      goto LAB_0031f85d;
    }
    bVar7 = ReadBasicType(this,(texcoord3f *)&local_2c8);
    if (!bVar7) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,"ParseDictElement",0x10);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
      poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
      local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_308,"Failed to parse a value of type `{}`","");
      local_2d8._8_2_ = 0x6633;
      goto LAB_0031f9de;
    }
    primvar::PrimVar::set_value<tinyusdz::value::texcoord3f>
              ((PrimVar *)&local_228,(texcoord3f *)&local_2c8);
    break;
  case 0x4e:
    if (uVar1 == '[') {
      local_2c8._M_allocated_capacity = 0;
      local_2c8._8_8_ = 0;
      local_2b8._M_allocated_capacity = 0;
      local_309 = ParseBasicTypeArray<tinyusdz::value::texcoord3d>
                            (this,(vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                                   *)&local_2c8);
      if (!local_309) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
        poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_308,"Failed to parse a value of type `{}[]`","");
        local_2d8._8_2_ = 0x6433;
        goto LAB_0031f769;
      }
      linb::any::operator=
                ((any *)&local_228,
                 (vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                  *)&local_2c8);
      goto LAB_0031f85d;
    }
    bVar7 = ReadBasicType(this,(texcoord3d *)&local_2c8);
    if (!bVar7) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,"ParseDictElement",0x10);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
      poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x353);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
      local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_308,"Failed to parse a value of type `{}`","");
      local_2d8._8_2_ = 0x6433;
      goto LAB_0031f9de;
    }
    linb::any::operator=((any *)&local_228,(texcoord3d *)&local_2c8);
    break;
  case 0x51:
    if (uVar1 == '[') {
      local_308._M_dataplus._M_p = (pointer)0x0;
      local_308._M_string_length = 0;
      local_308.field_2._M_allocated_capacity = 0;
      bVar7 = ParseBasicTypeArray<tinyusdz::value::AssetPath>
                        (this,(vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                               *)&local_308);
      if (bVar7) {
        linb::any::operator=
                  ((any *)&local_228,
                   (vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                    *)&local_308);
        ::std::vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>::
        ~vector((vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_> *)
                &local_308);
        break;
      }
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,"ParseDictElement",0x10);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
      poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x369);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,"Failed to parse `asset[]`",0x19);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"\n",1);
      ::std::__cxx11::stringbuf::str();
      PushError(this,(string *)local_2a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(fStack_2a4,local_2a8) != &aStack_298) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(fStack_2a4,local_2a8),
                        CONCAT44(aStack_298._M_allocated_capacity._4_4_,
                                 aStack_298._M_allocated_capacity._0_4_) + 1);
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1e8);
      ::std::ios_base::~ios_base(local_178);
      ::std::vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>::
      ~vector((vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_> *)
              &local_308);
    }
    else {
      _local_2a8 = (pointer)&aStack_298;
      fStack_2a0 = 0.0;
      fStack_29c = 0.0;
      aStack_298._M_allocated_capacity._0_4_ =
           (uint)(uint3)aStack_298._M_allocated_capacity._1_3_ << 8;
      uStack_288 = SUB82(&aStack_278,0);
      uStack_286 = (undefined2)((ulong)&aStack_278 >> 0x10);
      fStack_284 = (float)((ulong)&aStack_278 >> 0x20);
      local_280 = 0.0;
      fStack_27c = 0.0;
      aStack_278._M_allocated_capacity._0_4_ = aStack_278._M_allocated_capacity._0_4_ & 0xffffff00;
      bVar7 = ReadBasicType(this,(AssetPath *)local_2a8);
      if (bVar7) {
        linb::any::operator=((any *)&local_228,(AssetPath *)local_2a8);
        tinyusdz::value::AssetPath::~AssetPath((AssetPath *)local_2a8);
        break;
      }
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,"ParseDictElement",0x10);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
      poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x36f);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,"Failed to parse `asset`",0x17);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"\n",1);
      ::std::__cxx11::stringbuf::str();
      PushError(this,&local_308);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308._M_dataplus._M_p != &local_308.field_2) {
        operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1e8);
      ::std::ios_base::~ios_base(local_178);
      tinyusdz::value::AssetPath::~AssetPath((AssetPath *)local_2a8);
    }
    goto LAB_0031facc;
  case 0x52:
    aStack_298._8_8_ = &fStack_2a0;
    fStack_2a0 = 0.0;
    aStack_298._M_allocated_capacity._0_4_ = 0;
    aStack_298._M_allocated_capacity._4_4_ = 0;
    uStack_288 = (undefined2)aStack_298._8_8_;
    uStack_286 = (undefined2)((ulong)aStack_298._8_8_ >> 0x10);
    fStack_284 = (float)((ulong)aStack_298._8_8_ >> 0x20);
    local_280 = 0.0;
    fStack_27c = 0.0;
    bVar7 = ParseDict(this,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                            *)local_2a8);
    if (bVar7) {
      linb::any::operator=
                ((any *)&local_228,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                  *)local_2a8);
      ::std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
      ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                  *)local_2a8,
                 (_Link_type)
                 CONCAT44(aStack_298._M_allocated_capacity._4_4_,
                          aStack_298._M_allocated_capacity._0_4_));
      break;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1e8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1e8,"ParseDictElement",0x10);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"():",3);
    poVar10 = (ostream *)::std::ostream::operator<<(&local_1e8,0x37a);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1e8,"Failed to parse `dictionary`",0x1c);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"\n",1);
    ::std::__cxx11::stringbuf::str();
    PushError(this,&local_308);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_dataplus._M_p != &local_308.field_2) {
      operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1e8);
    ::std::ios_base::~ios_base(local_178);
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
    ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                *)local_2a8,
               (_Link_type)
               CONCAT44(aStack_298._M_allocated_capacity._4_4_,
                        aStack_298._M_allocated_capacity._0_4_));
LAB_0031facc:
    bVar7 = false;
    goto LAB_0031face;
  }
  local_1d8 = &linb::any::vtable_for_type<decltype(nullptr)>()::table;
  local_1e8.dynamic = (void *)0x0;
  local_1d0 = local_1c0;
  local_1c8 = 0;
  local_1c0[0]._M_local_buf[0] = '\0';
  linb::any::operator=((any *)&local_1e8,(any *)&local_228);
  ::std::__cxx11::string::_M_assign((string *)&local_1d0);
  ::std::__cxx11::string::_M_assign((string *)out_key);
  ::std::__cxx11::string::_M_assign((string *)&out_var->_name);
  linb::any::operator=((any *)out_var,(any *)&local_1e8);
  MetaVariable::~MetaVariable((MetaVariable *)&local_1e8);
  bVar7 = true;
LAB_0031face:
  ::std::
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             *)local_208);
  if ((undefined8 *)local_218._M_allocated_capacity != (undefined8 *)0x0) {
    (**(code **)(local_218._M_allocated_capacity + 0x20))(&local_228);
  }
LAB_00317f77:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
LAB_00317e26:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  return bVar7;
}

Assistant:

bool AsciiParser::ParseDictElement(std::string *out_key,
                                   MetaVariable *out_var) {
  (void)out_key;
  (void)out_var;

  // dict_element: type (array_qual?) name '=' value
  //           ;

  std::string type_name;

  if (!ReadIdentifier(&type_name)) {
    return false;
  }

  if (!SkipWhitespace()) {
    return false;
  }

  if (!IsSupportedPrimAttrType(type_name)) {
    PUSH_ERROR_AND_RETURN("Unknown or unsupported type `" + type_name + "`\n");
  }

  // Has array qualifier? `[]`
  bool array_qual = false;
  {
    char c0, c1;
    if (!Char1(&c0)) {
      return false;
    }

    if (c0 == '[') {
      if (!Char1(&c1)) {
        return false;
      }

      if (c1 == ']') {
        array_qual = true;
      } else {
        // Invalid syntax
        PUSH_ERROR_AND_RETURN("Invalid syntax found.");
      }

    } else {
      if (!Rewind(1)) {
        return false;
      }
    }
  }

  if (!SkipWhitespace()) {
    return false;
  }

  std::string key_name;
  if (!ReadIdentifier(&key_name)) {
    // string literal is also supported. e.g. "0"
    if (ReadStringLiteral(&key_name)) {
      // ok
    } else {
      PUSH_ERROR_AND_RETURN("Failed to parse dictionary key identifier.\n");
    }
  }

  if (!SkipWhitespace()) {
    return false;
  }

  if (!Expect('=')) {
    return false;
  }

  if (!SkipWhitespace()) {
    return false;
  }

  uint32_t tyid = value::GetTypeId(type_name);

  primvar::PrimVar var;

  //
  // Supports limited types for customData/Dictionary.
  //

  // TODO: Unify code with ParseMetaValue()

#define PARSE_BASE_TYPE(__ty)                                     \
  case value::TypeTraits<__ty>::type_id(): {                      \
    if (array_qual) {                                             \
      std::vector<__ty> vss;                                      \
      if (!ParseBasicTypeArray(&vss)) {                           \
        PUSH_ERROR_AND_RETURN(                                    \
            fmt::format("Failed to parse a value of type `{}[]`", \
                        value::TypeTraits<__ty>::type_name()));   \
      }                                                           \
      var.set_value(vss);                                         \
    } else {                                                      \
      __ty val;                                                   \
      if (!ReadBasicType(&val)) {                                 \
        PUSH_ERROR_AND_RETURN(                                    \
            fmt::format("Failed to parse a value of type `{}`",   \
                        value::TypeTraits<__ty>::type_name()));   \
      }                                                           \
      var.set_value(val);                                         \
    }                                                             \
    break;                                                        \
  }

  switch (tyid) {
    APPLY_TO_METAVARIABLE_TYPE(PARSE_BASE_TYPE)
    case value::TYPE_ID_STRING: {
      // FIXME: Use std::string
      if (array_qual) {
        std::vector<value::StringData> strs;
        if (!ParseBasicTypeArray(&strs)) {
          PUSH_ERROR_AND_RETURN("Failed to parse `string[]`");
        }
        var.set_value(strs);
      } else {
        value::StringData str;
        if (!ReadBasicType(&str)) {
          PUSH_ERROR_AND_RETURN("Failed to parse `string`");
        }
        var.set_value(str);
      }
      break;
    }
    case value::TYPE_ID_ASSET_PATH: {
      if (array_qual) {
        std::vector<value::AssetPath> arrs;
        if (!ParseBasicTypeArray(&arrs)) {
          PUSH_ERROR_AND_RETURN("Failed to parse `asset[]`");
        }
        var.set_value(arrs);
      } else {
        value::AssetPath asset;
        if (!ReadBasicType(&asset)) {
          PUSH_ERROR_AND_RETURN("Failed to parse `asset`");
        }
        var.set_value(asset);
      }
      break;
    }
    case value::TYPE_ID_DICT: {
      Dictionary dict;

      DCOUT("Parse dictionary");
      if (!ParseDict(&dict)) {
        PUSH_ERROR_AND_RETURN("Failed to parse `dictionary`");
      }
      var.set_value(dict);
      break;
    }
    default: {
      PUSH_ERROR_AND_RETURN("Unsupported or invalid type for Metadatum:" +
                            type_name);
    }
  }

#undef PARSE_BASE_TYPE

  MetaVariable metavar;
  metavar.set_value(key_name, var.value_raw());

  DCOUT("key: " << key_name << ", type: " << type_name);

  (*out_key) = key_name;
  (*out_var) = metavar;

  return true;
}